

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QBitArray *ba)

{
  char cVar1;
  undefined1 *logicalSize;
  char *pcVar2;
  qint64 qVar3;
  Status status;
  long len;
  long lVar4;
  long in_FS_OFFSET;
  quint32 tmp;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear(&ba->d);
  if (in->ver < 0x14) {
    _tmp = (undefined1 *)CONCAT44(uStack_3c,0xaaaaaaaa);
    QDataStream::operator>>(in,(qint32 *)&tmp);
    logicalSize = (undefined1 *)(long)(int)tmp;
    if ((long)(int)tmp < 0) {
LAB_00318d7d:
      status = ReadCorruptData;
    }
    else {
LAB_00318cc0:
      if (logicalSize == (undefined1 *)0x0) {
        QByteArray::clear(&ba->d);
        goto LAB_00318d88;
      }
      lVar4 = 0;
      do {
        len = ((ulong)(logicalSize + 7) >> 3) - lVar4;
        if (len == 0 || (long)((ulong)(logicalSize + 7) >> 3) < lVar4) {
          pcVar2 = QByteArray::back(&ba->d);
          cVar1 = *pcVar2;
          pcVar2 = QByteArray::data(&ba->d);
          adjust_head_and_tail(pcVar2,(ba->d).d.size,(qsizetype)logicalSize);
          pcVar2 = QByteArray::back(&ba->d);
          if (*pcVar2 == cVar1) goto LAB_00318d88;
          QByteArray::clear(&ba->d);
          goto LAB_00318d7d;
        }
        if (0x7fffff < len) {
          len = 0x800000;
        }
        QByteArray::resize(&ba->d,len + lVar4 + 1);
        pcVar2 = QByteArray::data(&ba->d);
        qVar3 = QDataStream::readRawData(in,pcVar2 + lVar4 + 1,len);
        lVar4 = len + lVar4;
      } while (qVar3 == len);
      QByteArray::clear(&ba->d);
      status = ReadPastEnd;
    }
  }
  else {
    _tmp = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in,(qint64 *)&tmp);
    logicalSize = _tmp;
    if (-1 < (long)_tmp) goto LAB_00318cc0;
    status = SizeLimitExceeded;
  }
  QDataStream::setStatus(in,status);
LAB_00318d88:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QBitArray &ba)
{
    ba.clear();
    qsizetype len;
    if (in.version() < QDataStream::Qt_6_0) {
        quint32 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint32((std::numeric_limits<qint32>::max)()))) {
            in.setStatus(QDataStream::ReadCorruptData);
            return in;
        }
        len = tmp;
    } else {
        quint64 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint64((std::numeric_limits<qsizetype>::max)()))) {
            in.setStatus(QDataStream::Status::SizeLimitExceeded);
            return in;
        }
        len = tmp;
    }
    if (len == 0) {
        ba.clear();
        return in;
    }

    const qsizetype Step = 8 * 1024 * 1024;
    const qsizetype totalBytes = storage_size(len);
    qsizetype allocated = 0;

    while (allocated < totalBytes) {
        qsizetype blockSize = qMin(Step, totalBytes - allocated);
        ba.d.resize(allocated + blockSize + 1);
        if (in.readRawData(ba.d.data() + 1 + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    }

    const auto fromStream = ba.d.back();
    adjust_head_and_tail(ba.d.data(), ba.d.size(), len);
    if (ba.d.back() != fromStream) {
        ba.clear();
        in.setStatus(QDataStream::ReadCorruptData);
        return in;
    }
    return in;
}